

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>
          (enum_<ImPlotAxisFlags_> *this,handle *scope,char *name,arithmetic *extra,
          char (*extra_1) [33])

{
  str_attr_accessor local_c8;
  arg local_a8;
  is_method local_98;
  name local_90;
  is_new_style_constructor local_82;
  type local_81;
  cpp_function local_80;
  type local_72;
  type local_71;
  arg local_70;
  anon_class_1_0_00000001 local_58;
  factory<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JoelLinn[P]py_mahi_gui_thirdparty_pybind11_include_pybind11_pybind11_h:1733:18),_pybind11::detail::void_type_(*)(),_ImPlotAxisFlags__(unsigned_int),_pybind11::detail::void_type_()>
  local_57;
  undefined1 local_56;
  undefined1 local_55;
  bool is_convertible;
  bool is_arithmetic;
  PyObject *local_48;
  PyObject *local_40;
  PyObject *local_38;
  char (*local_30) [33];
  char (*extra_local_1) [33];
  arithmetic *extra_local;
  char *name_local;
  handle *scope_local;
  enum_<ImPlotAxisFlags_> *this_local;
  
  local_38 = scope->m_ptr;
  local_30 = extra_1;
  extra_local_1 = (char (*) [33])extra;
  extra_local = (arithmetic *)name;
  name_local = (char *)scope;
  scope_local = (handle *)this;
  class_<ImPlotAxisFlags_>::class_<pybind11::arithmetic,char[33]>
            (&this->super_class_<ImPlotAxisFlags_>,(handle)local_38,name,extra,extra_1);
  local_40 = (this->super_class_<ImPlotAxisFlags_>).super_generic_type.super_object.super_handle.
             m_ptr;
  local_48 = *(PyObject **)name_local;
  pybind11::detail::enum_base::enum_base(&this->m_base,(handle)local_40,(handle)local_48);
  local_55 = 1;
  local_56 = 1;
  pybind11::detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x1);
  init<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(unsigned_int)_1_,pybind11::detail::initimpl::factory<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),ImPlotAxisFlags_(unsigned_int),pybind11::detail::void_type()>>
            (&local_58);
  pybind11::arg::arg(&local_70,"value");
  class_<ImPlotAxisFlags_>::
  def<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),ImPlotAxisFlags_(unsigned_int),pybind11::detail::void_type(),pybind11::arg>
            (&this->super_class_<ImPlotAxisFlags_>,&local_57,&local_70);
  class_<ImPlotAxisFlags_>::
  def<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(ImPlotAxisFlags_)_1_>
            (&this->super_class_<ImPlotAxisFlags_>,"__int__",&local_71);
  class_<ImPlotAxisFlags_>::
  def<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(ImPlotAxisFlags_)_2_>
            (&this->super_class_<ImPlotAxisFlags_>,"__index__",&local_72);
  pybind11::name::name(&local_90,"__setstate__");
  is_method::is_method(&local_98,(handle *)this);
  pybind11::arg::arg(&local_a8,"state");
  cpp_function::
  cpp_function<pybind11::enum_<ImPlotAxisFlags_>::enum_<pybind11::arithmetic,char[33]>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&,char_const(&)[33])::_lambda(pybind11::detail::value_and_holder&,unsigned_int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_80,&local_81,&local_82,&local_90,&local_98,&local_a8);
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_c8,(object_api<pybind11::handle> *)this,"__setstate__");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_c8,&local_80);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_c8);
  cpp_function::~cpp_function(&local_80);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Scalar>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }